

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O2

int archive_write_add_filter_lzma(archive *_a)

{
  int iVar1;
  archive_write_filter *f;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_add_filter_lzma");
  if (iVar1 == -0x1e) {
    iVar1 = -0x1e;
  }
  else {
    f = __archive_write_allocate_filter(_a);
    iVar1 = common_setup(f);
    if (iVar1 == 0) {
      f->code = 5;
      f->name = "lzma";
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
archive_write_add_filter_lzma(struct archive *_a)
{
	struct archive_write_filter *f;
	int r;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_lzma");
	f = __archive_write_allocate_filter(_a);
	r = common_setup(f);
	if (r == ARCHIVE_OK) {
		f->code = ARCHIVE_FILTER_LZMA;
		f->name = "lzma";
	}
	return (r);
}